

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

iterator * __thiscall
idx2::IncreaseCapacity<unsigned_long,idx2::sub_channel>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::sub_channel> *Ht,iterator *ItIn)

{
  hash_table<unsigned_long,_idx2::sub_channel> *Ht_00;
  hash_table<unsigned_long,_idx2::sub_channel> *extraout_RDX;
  hash_table<unsigned_long,_idx2::sub_channel> *Ht_01;
  sub_channel *in_R8;
  undefined1 local_c0 [8];
  iterator Result;
  sub_channel *local_90;
  hash_table<unsigned_long,_idx2::sub_channel> *local_88;
  undefined1 local_80 [8];
  iterator It;
  hash_table<unsigned_long,_idx2::sub_channel> NewHt;
  iterator *ItIn_local;
  hash_table<unsigned_long,_idx2::sub_channel> *Ht_local;
  
  __return_storage_ptr__->Key = Ht->Keys;
  __return_storage_ptr__->Val = Ht->Vals;
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::sub_channel> *)Ht->Stats;
  __return_storage_ptr__->Idx = Ht->Size;
  hash_table<unsigned_long,_idx2::sub_channel>::hash_table
            ((hash_table<unsigned_long,_idx2::sub_channel> *)&It.Idx);
  Init<unsigned_long,idx2::sub_channel>
            ((hash_table<unsigned_long,_idx2::sub_channel> *)&It.Idx,*(long *)(this + 0x20) + 1,
             *(allocator **)(this + 0x28));
  Begin<unsigned_long,idx2::sub_channel>((iterator *)local_80,this,Ht_00);
  Ht_01 = extraout_RDX;
  while (End<unsigned_long,idx2::sub_channel>((iterator *)&Result.Idx,this,Ht_01),
        It.Val != local_90 || It.Ht != local_88) {
    Insert<unsigned_long,idx2::sub_channel>
              ((iterator *)local_c0,(idx2 *)&It.Idx,
               (hash_table<unsigned_long,_idx2::sub_channel> *)local_80,It.Key,in_R8);
    if (*Ht->Keys == *(unsigned_long *)local_c0) {
      __return_storage_ptr__->Key = (unsigned_long *)local_c0;
      __return_storage_ptr__->Val = (sub_channel *)Result.Key;
      __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::sub_channel> *)Result.Val;
      __return_storage_ptr__->Idx = (i64)Result.Ht;
    }
    do {
      It.Ht = (hash_table<unsigned_long,_idx2::sub_channel> *)((long)&(It.Ht)->Keys + 1);
    } while (*(char *)((long)&(It.Ht)->Keys +
                      (long)&(((It.Val)->BlockExpStream).Stream.Alloc)->_vptr_allocator) != '\x02');
    local_80 = (undefined1  [8])(((It.Val)->BlockExpStream).Stream.Data + (long)It.Ht * 8);
    Ht_01 = (hash_table<unsigned_long,_idx2::sub_channel> *)((long)It.Ht * 0x70);
    It.Key = (unsigned_long *)((long)&Ht_01->Keys + ((It.Val)->BlockExpStream).Stream.Bytes);
  }
  Dealloc<unsigned_long,idx2::sub_channel>((hash_table<unsigned_long,_idx2::sub_channel> *)this);
  memcpy(this,&It.Idx,0x30);
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::sub_channel> *)this;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
IncreaseCapacity(hash_table<k, v>* Ht, const typename hash_table<k, v>::iterator& ItIn)
{
  auto ItOut = ItIn;
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
  {
    auto Result = Insert(&NewHt, *(It.Key), *(It.Val));
    if (*(ItIn.Key) == *(Result.Key))
      ItOut = Result;
  }
  Dealloc(Ht);
  *Ht = NewHt;
  ItOut.Ht = Ht;
  return ItOut;
}